

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O1

void compute_ideal_colors_and_weights_1plane
               (image_block *blk,partition_info *pi,endpoints_and_weights *ei)

{
  vfloat4 *pvVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  float fVar10;
  bool bVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint8_t (*pauVar15) [216];
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint i;
  undefined1 auVar20 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  partition_metrics pms [4];
  partition_metrics local_a8 [4];
  float fVar19;
  float fVar21;
  
  auVar20 = vcmpps_avx(*(undefined1 (*) [16])(blk->data_max).m,
                       *(undefined1 (*) [16])(blk->data_min).m,0);
  auVar20 = vblendps_avx(ZEXT816(0) << 0x40,auVar20,8);
  if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar20[0xf] < '\0') {
    compute_ideal_colors_and_weights_3_comp(blk,pi,ei,3);
    return;
  }
  bVar3 = blk->texel_count;
  if (bVar3 == 0) {
    __assert_fail("texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x212,
                  "void compute_ideal_colors_and_weights_4_comp(const image_block &, const partition_info &, endpoints_and_weights &)"
                 );
  }
  uVar5 = pi->partition_count;
  if ((ulong)uVar5 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                  ,0x213,
                  "void compute_ideal_colors_and_weights_4_comp(const image_block &, const partition_info &, endpoints_and_weights &)"
                 );
  }
  uVar2 = *(undefined8 *)((blk->channel_weight).m + 2);
  fVar19 = (float)uVar2;
  auVar20._0_4_ = fVar19 + (blk->channel_weight).m[0];
  fVar21 = (float)((ulong)uVar2 >> 0x20);
  auVar20._4_4_ = fVar21 + (blk->channel_weight).m[1];
  auVar20._8_4_ = fVar19 + (blk->channel_weight).m[2];
  auVar20._12_4_ = fVar21 + (blk->channel_weight).m[3];
  auVar20 = vhaddps_avx(auVar20,auVar20);
  compute_avgs_and_dirs_4_comp(pi,blk,local_a8);
  pauVar15 = pi->texels_of_partition;
  bVar11 = true;
  uVar17 = 0;
  auVar23._8_4_ = 0x3f000000;
  auVar23._0_8_ = 0x3f0000003f000000;
  auVar23._12_4_ = 0x3f000000;
  auVar30._8_4_ = 0x3f800000;
  auVar30._0_8_ = 0x3f8000003f800000;
  auVar30._12_4_ = 0x3f800000;
  fVar19 = 0.0;
  do {
    auVar34 = *(undefined1 (*) [16])local_a8[uVar17].dir.m;
    auVar36 = vhaddps_avx(auVar34,auVar34);
    if (auVar36._0_4_ + local_a8[uVar17].dir.m[2] < 0.0) {
      auVar34 = vsubps_avx(ZEXT816(0) << 0x40,auVar34);
    }
    auVar26._0_4_ = auVar34._0_4_ * auVar34._0_4_;
    auVar26._4_4_ = auVar34._4_4_ * auVar34._4_4_;
    auVar26._8_4_ = auVar34._8_4_ * auVar34._8_4_;
    auVar26._12_4_ = auVar34._12_4_ * auVar34._12_4_;
    auVar36 = vshufpd_avx(auVar26,auVar26,1);
    auVar24._0_4_ = auVar26._0_4_ + auVar36._0_4_;
    auVar24._4_4_ = auVar26._4_4_ + auVar36._4_4_;
    auVar24._8_4_ = auVar26._8_4_ + auVar36._8_4_;
    auVar24._12_4_ = auVar26._12_4_ + auVar36._12_4_;
    auVar36 = vhaddps_avx(auVar24,auVar24);
    fVar21 = auVar36._0_4_;
    auVar36._4_4_ = fVar21;
    auVar36._0_4_ = fVar21;
    auVar36._8_4_ = fVar21;
    auVar36._12_4_ = fVar21;
    auVar36 = vsqrtps_avx(auVar36);
    auVar34 = vdivps_avx(auVar34,auVar36);
    if ((fVar21 == 0.0) && (!NAN(fVar21))) {
      auVar34 = auVar23;
    }
    auVar36 = *(undefined1 (*) [16])local_a8[uVar17].avg.m;
    uVar16 = (ulong)pi->partition_texel_count[uVar17];
    auVar26 = SUB6416(ZEXT464(0xd01502f9),0);
    auVar24 = SUB6416(ZEXT464(0x501502f9),0);
    fVar21 = auVar34._0_4_;
    fVar31 = auVar34._4_4_;
    fVar32 = auVar34._8_4_;
    fVar33 = auVar34._12_4_;
    if (uVar16 != 0) {
      uVar18 = 0;
      do {
        bVar4 = (*pauVar15)[uVar18];
        auVar34 = vinsertps_avx(ZEXT416((uint)blk->data_r[bVar4]),ZEXT416((uint)blk->data_g[bVar4]),
                                0x10);
        auVar34 = vinsertps_avx(auVar34,ZEXT416((uint)blk->data_b[bVar4]),0x20);
        auVar34 = vinsertps_avx(auVar34,ZEXT416((uint)blk->data_a[bVar4]),0x30);
        auVar34 = vsubps_avx(auVar34,auVar36);
        auVar37._0_4_ = fVar21 * auVar34._0_4_;
        auVar37._4_4_ = fVar31 * auVar34._4_4_;
        auVar37._8_4_ = fVar32 * auVar34._8_4_;
        auVar37._12_4_ = fVar33 * auVar34._12_4_;
        auVar34 = vshufpd_avx(auVar37,auVar37,1);
        auVar38._0_4_ = auVar37._0_4_ + auVar34._0_4_;
        auVar38._4_4_ = auVar37._4_4_ + auVar34._4_4_;
        auVar38._8_4_ = auVar37._8_4_ + auVar34._8_4_;
        auVar38._12_4_ = auVar37._12_4_ + auVar34._12_4_;
        auVar34 = vhaddps_avx(auVar38,auVar38);
        ei->weights[bVar4] = auVar34._0_4_;
        auVar24 = vminss_avx(auVar34,auVar24);
        auVar26 = vmaxss_avx(auVar34,auVar26);
        uVar18 = uVar18 + 1;
      } while (uVar16 != uVar18);
    }
    auVar34 = auVar24;
    if (auVar26._0_4_ <= auVar24._0_4_) {
      auVar34 = ZEXT816(0) << 0x20;
    }
    auVar24 = vcmpss_avx(auVar26,auVar24,6);
    auVar26 = vblendvps_avx(SUB6416(ZEXT464(0x33d6bf95),0),auVar26,auVar24);
    fVar35 = auVar34._0_4_;
    fVar39 = auVar26._0_4_;
    fVar7 = fVar39 - fVar35;
    fVar6 = fVar7 * fVar7;
    fVar10 = fVar6;
    if (uVar17 != 0) {
      bVar11 = (bool)(fVar6 == fVar19 & bVar11);
      fVar10 = fVar19;
    }
    fVar19 = fVar10;
    pvVar1 = (ei->ep).endpt0 + uVar17;
    pvVar1->m[0] = auVar36._0_4_ + fVar21 * fVar35;
    pvVar1->m[1] = auVar36._4_4_ + fVar31 * fVar35;
    pvVar1->m[2] = auVar36._8_4_ + fVar32 * fVar35;
    pvVar1->m[3] = auVar36._12_4_ + fVar33 * fVar35;
    pvVar1 = (ei->ep).endpt1 + uVar17;
    pvVar1->m[0] = auVar36._0_4_ + fVar21 * fVar39;
    pvVar1->m[1] = auVar36._4_4_ + fVar31 * fVar39;
    pvVar1->m[2] = auVar36._8_4_ + fVar32 * fVar39;
    pvVar1->m[3] = auVar36._12_4_ + fVar33 * fVar39;
    if (uVar16 != 0) {
      fVar6 = fVar6 * auVar20._0_4_ * 0.25;
      uVar18 = 0;
      do {
        bVar4 = (*pauVar15)[uVar18];
        auVar34 = ZEXT416((uint)((1.0 / fVar7) * (ei->weights[bVar4] - fVar35)));
        auVar36 = vmaxss_avx(auVar34,ZEXT816(0) << 0x40);
        auVar34 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar34,1);
        auVar34 = vblendvps_avx(auVar36,auVar30,auVar34);
        ei->weights[bVar4] = auVar34._0_4_;
        ei->weight_error_scale[bVar4] = fVar6;
        if (NAN(fVar6)) {
          __assert_fail("!astc::isnan(ei.weight_error_scale[tix])",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_ideal_endpoints_and_weights.cpp"
                        ,0x254,
                        "void compute_ideal_colors_and_weights_4_comp(const image_block &, const partition_info &, endpoints_and_weights &)"
                       );
        }
        uVar18 = uVar18 + 1;
      } while (uVar16 != uVar18);
    }
    uVar17 = uVar17 + 1;
    pauVar15 = pauVar15 + 1;
  } while (uVar17 != uVar5);
  uVar12 = bVar3 + 7 & 0xfffffff8;
  if (bVar3 < uVar12) {
    uVar17 = (ulong)(uint)bVar3;
    lVar13 = uVar12 - uVar17;
    lVar14 = lVar13 + -1;
    auVar25._8_8_ = lVar14;
    auVar25._0_8_ = lVar14;
    auVar25._16_8_ = lVar14;
    auVar25._24_8_ = lVar14;
    uVar16 = 0;
    auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar22._8_8_ = 0x8000000000000000;
    auVar22._0_8_ = 0x8000000000000000;
    auVar22._16_8_ = 0x8000000000000000;
    auVar22._24_8_ = 0x8000000000000000;
    auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar27 = SUB6432(ZEXT464(0xd01502f9),0);
    auVar27 = vpcmpeqd_avx2(auVar27,auVar27);
    do {
      auVar28._8_8_ = uVar16;
      auVar28._0_8_ = uVar16;
      auVar28._16_8_ = uVar16;
      auVar28._24_8_ = uVar16;
      auVar29 = vpor_avx2(auVar28,auVar8);
      auVar28 = vpor_avx2(auVar28,auVar9);
      auVar28 = vpcmpgtq_avx2(auVar28 ^ auVar22,auVar25 ^ auVar22);
      auVar29 = vpcmpgtq_avx2(auVar29 ^ auVar22,auVar25 ^ auVar22);
      auVar28 = vpackssdw_avx2(auVar29,auVar28);
      auVar20 = vpackssdw_avx(SUB3216(auVar28 ^ auVar27,0),SUB3216(auVar28 ^ auVar27,0x10));
      auVar20 = vpshufd_avx(auVar20,0xd8);
      auVar28 = vpmovzxwd_avx2(auVar20);
      auVar29 = vpslld_avx2(auVar28,0x1f);
      auVar28 = vmaskmovps_avx(auVar29,ZEXT832(0));
      *(undefined1 (*) [32])(ei->weights + uVar17 + uVar16) = auVar28;
      auVar28 = vmaskmovps_avx(auVar29,ZEXT832(0));
      *(undefined1 (*) [32])(ei->weight_error_scale + uVar17 + uVar16) = auVar28;
      uVar16 = uVar16 + 8;
    } while ((lVar13 + 7U & 0xfffffffffffffff8) != uVar16);
  }
  ei->is_constant_weight_error_scale = bVar11;
  return;
}

Assistant:

void compute_ideal_colors_and_weights_1plane(
	const image_block& blk,
	const partition_info& pi,
	endpoints_and_weights& ei
) {
	bool uses_alpha = !blk.is_constant_channel(3);

	if (uses_alpha)
	{
		compute_ideal_colors_and_weights_4_comp(blk, pi, ei);
	}
	else
	{
		compute_ideal_colors_and_weights_3_comp(blk, pi, ei, 3);
	}
}